

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O0

void __thiscall
icu_63::TimeZoneFormat::setGMTOffsetDigits
          (TimeZoneFormat *this,UnicodeString *digits,UErrorCode *status)

{
  UBool UVar1;
  UChar32 local_48 [2];
  UChar32 digitArray [10];
  UErrorCode *status_local;
  UnicodeString *digits_local;
  TimeZoneFormat *this_local;
  
  digitArray._32_8_ = status;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    UVar1 = toCodePoints(digits,local_48,10);
    if (UVar1 == '\0') {
      *(undefined4 *)digitArray._32_8_ = 1;
    }
    else {
      memcpy(this->fGMTOffsetDigits,local_48,0x28);
    }
  }
  return;
}

Assistant:

void
TimeZoneFormat::setGMTOffsetDigits(const UnicodeString& digits, UErrorCode& status) {
    if (U_FAILURE(status)) {
        return;
    }
    UChar32 digitArray[10];
    if (!toCodePoints(digits, digitArray, 10)) {
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }
    uprv_memcpy(fGMTOffsetDigits, digitArray, sizeof(UChar32)*10);
}